

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalSubscriptMat4x2(ShaderEvalContext *c)

{
  Vector<float,_2> local_80;
  Vector<float,_2> local_78;
  Vector<float,_2> local_70;
  Vector<float,_2> local_68;
  Vector<float,_2> local_60;
  Vector<float,_2> local_58;
  Vector<float,_2> local_50;
  Vector<float,_2> local_48;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  VecAccess<float,_4,_2> local_30;
  
  local_78.m_data = *(float (*) [2])(c->coords).m_data;
  local_58.m_data[1] = (c->coords).m_data[2];
  local_58.m_data[0] = local_78.m_data[1];
  tcu::operator*(0.5,&local_58);
  tcu::operator+(&local_78,&local_50);
  local_80.m_data = *(float (*) [2])((c->coords).m_data + 2);
  tcu::operator*(0.25,&local_80);
  tcu::operator+(&local_48,&local_60);
  local_70.m_data[1] = (c->coords).m_data[0];
  local_70.m_data[0] = (c->coords).m_data[3];
  tcu::operator*(0.125,&local_70);
  tcu::operator+(&local_40,&local_68);
  local_30.m_vector = &c->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  tcu::VecAccess<float,_4,_2>::operator=(&local_30,&local_38);
  return;
}

Assistant:

void evalSubscriptMat4x2	(ShaderEvalContext& c) { c.color.xy()	= c.coords.swizzle(0,1) + 0.5f*c.coords.swizzle(1,2) + 0.25f*c.coords.swizzle(2,3) + 0.125f*c.coords.swizzle(3,0); }